

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O1

CURLcode pop3_state_auth_digest_resp(connectdata *conn,int pop3code,pop3state instate)

{
  SessionHandle *data;
  CURLcode CVar1;
  char *chlg64;
  char *rplyb64;
  size_t len;
  char *local_20;
  size_t local_18;
  
  data = conn->data;
  local_18 = 0;
  local_20 = (char *)0x0;
  if (pop3code != 0x2b) {
    Curl_failf(data,"Access denied: %d",(ulong)(uint)pop3code);
    return CURLE_LOGIN_DENIED;
  }
  for (chlg64 = (data->state).buffer + 2; (*chlg64 == ' ' || (*chlg64 == '\t')); chlg64 = chlg64 + 1
      ) {
  }
  CVar1 = Curl_sasl_create_digest_md5_message
                    (data,chlg64,conn->user,conn->passwd,"pop",&local_20,&local_18);
  if (CVar1 != CURLE_OK) {
    return CVar1;
  }
  if (local_20 != (char *)0x0) {
    CVar1 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s");
    if (CVar1 != CURLE_OK) goto LAB_00134d1e;
    (conn->proto).ftpc.count2 = 9;
  }
  CVar1 = CURLE_OK;
LAB_00134d1e:
  if (local_20 != (char *)0x0) {
    (*Curl_cfree)(local_20);
  }
  return CVar1;
}

Assistant:

static CURLcode pop3_state_auth_digest_resp(struct connectdata *conn,
                                            int pop3code,
                                            pop3state instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  char *chlg64 = data->state.buffer;
  size_t len = 0;
  char *rplyb64 = NULL;

  (void)instate; /* no use for this yet */

  if(pop3code != '+') {
    failf(data, "Access denied: %d", pop3code);
    return CURLE_LOGIN_DENIED;
  }

  /* Get the challenge */
  for(chlg64 += 2; *chlg64 == ' ' || *chlg64 == '\t'; chlg64++)
    ;

  /* Create the response message */
  result = Curl_sasl_create_digest_md5_message(data, chlg64, conn->user,
                                               conn->passwd, "pop",
                                               &rplyb64, &len);

  /* Send the response */
  if(!result) {
    if(rplyb64) {
      result = Curl_pp_sendf(&conn->proto.pop3c.pp, "%s", rplyb64);

      if(!result)
        state(conn, POP3_AUTH_DIGESTMD5_RESP);
    }

    Curl_safefree(rplyb64);
  }

  return result;
}